

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O1

compile_errcode __thiscall CompoundStatement::Parse(CompoundStatement *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  
  SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
  if (SVar1 == CONST_SYM) {
    cVar2 = ConstantDeclaration::Parse(&this->m_constant_declaration);
    if (cVar2 == 0) {
      ConstantDeclaration::LogOutput(&this->m_constant_declaration);
    }
  }
  cVar2 = VariableDeclaration::Parse(&this->m_variable_declaration);
  if (cVar2 == 0) {
    VariableDeclaration::LogOutput(&this->m_variable_declaration);
  }
  StatementList::Parse(&this->m_statement_list);
  return 0;
}

Assistant:

compile_errcode CompoundStatement::Parse() {
    int ret = COMPILE_OK;
    SymbolName name = handle_symbol_queue->GetCurrentName();
    if (name == CONST_SYM) {
        if ((ret = m_constant_declaration.Parse()) == COMPILE_OK) {
            m_constant_declaration.LogOutput();
        }
    }
    if ((ret = m_variable_declaration.Parse()) == COMPILE_OK) {
        m_variable_declaration.LogOutput();
    }
    m_statement_list.Parse();
    return COMPILE_OK;
}